

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

void __thiscall wasm::Precompute::considerPartiallyPrecomputing(Precompute *this,Expression *curr)

{
  Module *wasm;
  bool bVar1;
  value_type pSVar2;
  value_type local_28;
  Select *select;
  
  if (this->canPartiallyPrecompute == true) {
    pSVar2 = (value_type)0x0;
    if (curr->_id == SelectId) {
      pSVar2 = (value_type)curr;
    }
    if (pSVar2 != (value_type)0x0) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
             ).
             super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .
             super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .currModule;
      local_28 = pSVar2;
      bVar1 = Properties::isValidConstantExpression(wasm,pSVar2->ifTrue);
      if (((bVar1) && (bVar1 = Properties::isValidConstantExpression(wasm,pSVar2->ifFalse), bVar1))
         && ((value_type)
             ((this->
              super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
              ).
              super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
              .
              super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .currFunction)->body != pSVar2)) {
        std::__detail::
        _Insert_base<wasm::Select_*,_wasm::Select_*,_std::allocator<wasm::Select_*>,_std::__detail::_Identity,_std::equal_to<wasm::Select_*>,_std::hash<wasm::Select_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<wasm::Select_*,_wasm::Select_*,_std::allocator<wasm::Select_*>,_std::__detail::_Identity,_std::equal_to<wasm::Select_*>,_std::hash<wasm::Select_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->partiallyPrecomputable,&local_28);
      }
    }
  }
  return;
}

Assistant:

void considerPartiallyPrecomputing(Expression* curr) {
    if (!canPartiallyPrecompute) {
      return;
    }

    if (auto* select = curr->dynCast<Select>()) {
      // We only have a reasonable hope of success if the select arms are things
      // like constants or global gets. At a first approximation, allow the set
      // of things we allow in constant initializers (but we can probably allow
      // more here TODO).
      //
      // We also ignore selects with no parent (that are the entire function
      // body) as then there is nothing to optimize into their arms.
      auto& wasm = *getModule();
      if (Properties::isValidConstantExpression(wasm, select->ifTrue) &&
          Properties::isValidConstantExpression(wasm, select->ifFalse) &&
          getFunction()->body != select) {
        partiallyPrecomputable.insert(select);
      }
    }
  }